

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O2

void __thiscall
HuffTree::add_code(HuffTree *this,char data,vector<bool,_std::allocator<bool>_> *code)

{
  ulong *puVar1;
  undefined8 uVar2;
  _Head_base<0UL,_HuffTree::TreeNode_*,_false> _Var3;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *puVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  ulong uVar7;
  ulong *puVar8;
  undefined1 local_68 [20];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  local_68._8_4_ = (undefined4)CONCAT71(in_register_00000031,data);
  _Var3._M_head_impl =
       (this->root)._M_t.
       super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
       super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
       super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
  this->curr_node = _Var3._M_head_impl;
  puVar8 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar1 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  local_68._12_4_ =
       (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish
       .super__Bit_iterator_base._M_offset;
  uVar7 = 0;
  while ((uVar6 = (uint)uVar7, puVar8 != puVar1 || (uVar6 != local_68._12_4_))) {
    if ((*puVar8 >> (uVar7 & 0x3f) & 1) == 0) {
      if ((_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
          ((_Var3._M_head_impl)->_left)._M_t.
          super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
          == (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0)
      {
        (_Var3._M_head_impl)->_is_leaf = false;
        local_68._16_4_ = 0x20;
        uStack_54 = 0;
        uStack_50._0_1_ = false;
        uStack_50._1_3_ = 0;
        uStack_4c = 0;
        local_48 = 0;
        uStack_44 = 0;
        uStack_40 = 1;
        std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)local_68);
        uVar2 = local_68._0_8_;
        local_68._0_8_ =
             (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
        std::__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::reset
                  ((__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   &this->curr_node->_left,(pointer)uVar2);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   local_68);
        TreeNode::~TreeNode((TreeNode *)(local_68 + 0x10));
        _Var3._M_head_impl = this->curr_node;
      }
      puVar4 = &(_Var3._M_head_impl)->_left;
    }
    else {
      if ((_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
          ((_Var3._M_head_impl)->_right)._M_t.
          super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
          == (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0)
      {
        (_Var3._M_head_impl)->_is_leaf = false;
        local_68._16_4_ = 0x20;
        uStack_54 = 0;
        uStack_50._0_1_ = false;
        uStack_50._1_3_ = 0;
        uStack_4c = 0;
        local_48 = 0;
        uStack_44 = 0;
        uStack_40 = 1;
        std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)local_68);
        uVar2 = local_68._0_8_;
        local_68._0_8_ =
             (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
        std::__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::reset
                  ((__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   &this->curr_node->_right,(pointer)uVar2);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   local_68);
        TreeNode::~TreeNode((TreeNode *)(local_68 + 0x10));
        _Var3._M_head_impl = this->curr_node;
      }
      puVar4 = &(_Var3._M_head_impl)->_right;
    }
    _Var3._M_head_impl =
         (puVar4->_M_t).
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    this->curr_node = _Var3._M_head_impl;
    uVar5 = uVar6 + 1;
    puVar8 = puVar8 + (uVar6 == 0x3f);
    if (uVar6 == 0x3f) {
      uVar5 = 0;
    }
    uVar7 = (ulong)uVar5;
  }
  (_Var3._M_head_impl)->_data = (char)local_68._8_4_;
  (_Var3._M_head_impl)->_is_leaf = true;
  return;
}

Assistant:

void HuffTree::add_code(char data, std::vector<bool> code) {
    back_to_root();
    for (bool bit : code) {
        if (bit) {
            if (!curr_node->_right) {
                curr_node->_is_leaf = false;
                curr_node->_right = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_right.get();
        } else {
            if (!curr_node->_left) {
                curr_node->_is_leaf = false;
                curr_node->_left = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_left.get();
        }
    }
    curr_node->_data = data;
    curr_node->_is_leaf = true;
}